

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O1

int __thiscall
OSSLRSA::verify(OSSLRSA *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  ulong uVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  ByteString *pBVar5;
  size_t sVar6;
  RSA *pRVar7;
  uchar *puVar8;
  uchar *puVar9;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  EVP_MD *pEVar10;
  size_t sVar11;
  long lVar12;
  undefined8 uVar13;
  char *format;
  long in_stack_00000008;
  ByteString local_60;
  EVP_MD *local_38;
  
  iVar4 = (int)tbs;
  if (iVar4 == 1) {
    cVar2 = (**(code **)(*(long *)ctx + 0x18))(ctx,OSSLRSAPublicKey::type);
    if (cVar2 == '\0') {
      format = "Invalid key type supplied";
      iVar4 = 0x329;
      goto LAB_00124863;
    }
    ByteString::ByteString(&local_60);
    pBVar5 = (ByteString *)(**(code **)(*(long *)ctx + 0x40))(ctx);
    sVar6 = ByteString::size(pBVar5);
    ByteString::resize(&local_60,sVar6);
    pRVar7 = (RSA *)OSSLRSAPublicKey::getOSSLKey((OSSLRSAPublicKey *)ctx);
    sVar6 = ByteString::size((ByteString *)siglen);
    puVar8 = ByteString::const_byte_str((ByteString *)siglen);
    puVar9 = ByteString::operator[](&local_60,0);
    iVar4 = RSA_public_decrypt((int)sVar6,puVar8,puVar9,pRVar7,3);
    if (iVar4 == -1) {
      iVar4 = 0;
      softHSMLog(3,"verify",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                 ,0x33b,"Public key operation failed");
    }
    else {
      ByteString::resize(&local_60,(long)iVar4);
      bVar3 = ByteString::operator==((ByteString *)sig,&local_60);
      iVar4 = (int)CONCAT71(extraout_var_00,bVar3);
    }
    goto LAB_001249da;
  }
  if (iVar4 != 10) {
    if (iVar4 != 3) {
      iVar4 = AsymmetricAlgorithm::verify
                        (&this->super_AsymmetricAlgorithm,ctx,sig,siglen,tbs,tbslen);
      return iVar4;
    }
    cVar2 = (**(code **)(*(long *)ctx + 0x18))(ctx,OSSLRSAPublicKey::type);
    if (cVar2 != '\0') {
      ByteString::ByteString(&local_60);
      pBVar5 = (ByteString *)(**(code **)(*(long *)ctx + 0x40))(ctx);
      sVar6 = ByteString::size(pBVar5);
      ByteString::resize(&local_60,sVar6);
      pRVar7 = (RSA *)OSSLRSAPublicKey::getOSSLKey((OSSLRSAPublicKey *)ctx);
      sVar6 = ByteString::size((ByteString *)siglen);
      puVar8 = ByteString::const_byte_str((ByteString *)siglen);
      puVar9 = ByteString::operator[](&local_60,0);
      iVar4 = RSA_public_decrypt((int)sVar6,puVar8,puVar9,pRVar7,1);
      if (iVar4 == -1) {
        iVar4 = 0;
        softHSMLog(3,"verify",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0x2c3,"Public key operation failed");
      }
      else {
        ByteString::resize(&local_60,(long)iVar4);
        bVar3 = ByteString::operator==((ByteString *)sig,&local_60);
        iVar4 = (int)CONCAT71(extraout_var,bVar3);
      }
      goto LAB_001249da;
    }
    format = "Invalid key type supplied";
    iVar4 = 0x2b1;
LAB_00124863:
    softHSMLog(3,"verify",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
               ,iVar4,format);
    return 0;
  }
  if (tbslen == 0 || in_stack_00000008 != 0x10) {
    format = "Invalid parameters supplied";
    iVar4 = 0x2d2;
    goto LAB_00124863;
  }
  cVar2 = (**(code **)(*(long *)ctx + 0x18))(ctx,OSSLRSAPublicKey::type);
  if (cVar2 == '\0') {
    format = "Invalid key type supplied";
    iVar4 = 0x2da;
    goto LAB_00124863;
  }
  ByteString::ByteString(&local_60);
  pBVar5 = (ByteString *)(**(code **)(*(long *)ctx + 0x40))(ctx);
  sVar6 = ByteString::size(pBVar5);
  ByteString::resize(&local_60,sVar6);
  pRVar7 = (RSA *)OSSLRSAPublicKey::getOSSLKey((OSSLRSAPublicKey *)ctx);
  sVar6 = ByteString::size((ByteString *)siglen);
  puVar8 = ByteString::const_byte_str((ByteString *)siglen);
  puVar9 = ByteString::operator[](&local_60,0);
  iVar4 = RSA_public_decrypt((int)sVar6,puVar8,puVar9,pRVar7,3);
  if (iVar4 == -1) {
    iVar4 = 0;
    softHSMLog(3,"verify",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
               ,0x2ec,"Public key operation failed");
    goto LAB_001249da;
  }
  ByteString::resize(&local_60,(long)iVar4);
  switch(*(undefined4 *)tbslen) {
  case 2:
    pEVar10 = EVP_sha1();
    sVar6 = 0x14;
    break;
  case 3:
    pEVar10 = EVP_sha224();
    sVar6 = 0x1c;
    break;
  case 4:
    pEVar10 = EVP_sha256();
    sVar6 = 0x20;
    break;
  case 5:
    pEVar10 = EVP_sha384();
    sVar6 = 0x30;
    break;
  case 6:
    pEVar10 = EVP_sha512();
    sVar6 = 0x40;
    break;
  default:
    goto switchD_001247e7_default;
  }
  sVar11 = ByteString::size((ByteString *)sig);
  if (sVar11 == sVar6) {
    uVar1 = *(ulong *)(tbslen + 8);
    local_38 = pEVar10;
    lVar12 = (**(code **)(*(long *)ctx + 0x20))(ctx);
    if (((lVar12 + 6U >> 3) - sVar6) - 2 < uVar1) {
      uVar13 = (**(code **)(*(long *)ctx + 0x20))(ctx);
      iVar4 = 0;
      softHSMLog(3,"verify",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                 ,0x318,"sLen (%lu) is too large for current key size (%lu)",uVar1,uVar13);
    }
    else {
      puVar8 = ByteString::const_byte_str((ByteString *)sig);
      puVar9 = ByteString::const_byte_str(&local_60);
      iVar4 = RSA_verify_PKCS1_PSS_mgf1(pRVar7,puVar8,local_38,local_38,puVar9,*(int *)(tbslen + 8))
      ;
      iVar4 = (int)CONCAT71((int7)((ulong)puVar8 >> 8),iVar4 == 1);
    }
  }
  else {
switchD_001247e7_default:
    iVar4 = 0;
  }
LAB_001249da:
  local_60._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_60.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return iVar4;
}

Assistant:

bool OSSLRSA::verify(PublicKey* publicKey, const ByteString& originalData,
		     const ByteString& signature, const AsymMech::Type mechanism,
		     const void* param /* = NULL */, const size_t paramLen /* = 0 */)
{
	if (mechanism == AsymMech::RSA_PKCS)
	{
		// Specific implementation for PKCS #1 only verification; originalData is assumed to contain
		// a digestInfo structure and verification is performed by comparing originalData to the data
		// recovered from the signature

		// Check if the public key is the right type
		if (!publicKey->isOfType(OSSLRSAPublicKey::type))
		{
			ERROR_MSG("Invalid key type supplied");

			return false;
		}

		// Perform the RSA public key operation
		OSSLRSAPublicKey* osslKey = (OSSLRSAPublicKey*) publicKey;

		ByteString recoveredData;

		recoveredData.resize(osslKey->getN().size());

		RSA* rsa = osslKey->getOSSLKey();

		int retLen = RSA_public_decrypt(signature.size(), (unsigned char*) signature.const_byte_str(), &recoveredData[0], rsa, RSA_PKCS1_PADDING);

		if (retLen == -1)
		{
			ERROR_MSG("Public key operation failed");

			return false;
		}

		recoveredData.resize(retLen);

		return (originalData == recoveredData);
	}
	else if (mechanism == AsymMech::RSA_PKCS_PSS)
	{
		const RSA_PKCS_PSS_PARAMS *pssParam = (RSA_PKCS_PSS_PARAMS*)param;

		if (pssParam == NULL || paramLen != sizeof(RSA_PKCS_PSS_PARAMS))
		{
			ERROR_MSG("Invalid parameters supplied");

			return false;
		}

		// Check if the public key is the right type
		if (!publicKey->isOfType(OSSLRSAPublicKey::type))
		{
			ERROR_MSG("Invalid key type supplied");

			return false;
		}

		// Perform the RSA public key operation
		OSSLRSAPublicKey* osslKey = (OSSLRSAPublicKey*) publicKey;

		ByteString recoveredData;

		recoveredData.resize(osslKey->getN().size());

		RSA* rsa = osslKey->getOSSLKey();

		int retLen = RSA_public_decrypt(signature.size(), (unsigned char*) signature.const_byte_str(), &recoveredData[0], rsa, RSA_NO_PADDING);

		if (retLen == -1)
		{
			ERROR_MSG("Public key operation failed");

			return false;
		}

		recoveredData.resize(retLen);

		size_t allowedLen;
		const EVP_MD* hash = NULL;

		switch (pssParam->hashAlg)
		{
		case HashAlgo::SHA1:
			hash = EVP_sha1();
			allowedLen = 20;
			break;
		case HashAlgo::SHA224:
			hash = EVP_sha224();
			allowedLen = 28;
			break;
		case HashAlgo::SHA256:
			hash = EVP_sha256();
			allowedLen = 32;
			break;
		case HashAlgo::SHA384:
			hash = EVP_sha384();
			allowedLen = 48;
			break;
		case HashAlgo::SHA512:
			hash = EVP_sha512();
			allowedLen = 64;
			break;
		default:
			return false;
		}

		if (originalData.size() != allowedLen) {
			return false;
		}

		size_t sParamLen = pssParam->sLen;
		if (sParamLen > ((osslKey->getBitLength()+6)/8-2-allowedLen))
		{
			ERROR_MSG("sLen (%lu) is too large for current key size (%lu)",
				  (unsigned long)sParamLen, osslKey->getBitLength());
			return false;
		}

		int status = RSA_verify_PKCS1_PSS_mgf1(rsa, (unsigned char*)originalData.const_byte_str(), hash, hash, (unsigned char*) recoveredData.const_byte_str(), pssParam->sLen);

		return (status == 1);
	}
	else if (mechanism == AsymMech::RSA)
	{
		// Specific implementation for raw RSA verifiction; originalData is assumed to contain the
		// full input data used to compute the signature and verification is performed by comparing
		// originalData to the data recovered from the signature

		// Check if the public key is the right type
		if (!publicKey->isOfType(OSSLRSAPublicKey::type))
		{
			ERROR_MSG("Invalid key type supplied");

			return false;
		}

		// Perform the RSA public key operation
		OSSLRSAPublicKey* osslKey = (OSSLRSAPublicKey*) publicKey;

		ByteString recoveredData;

		recoveredData.resize(osslKey->getN().size());

		RSA* rsa = osslKey->getOSSLKey();

		int retLen = RSA_public_decrypt(signature.size(), (unsigned char*) signature.const_byte_str(), &recoveredData[0], rsa, RSA_NO_PADDING);

		if (retLen == -1)
		{
			ERROR_MSG("Public key operation failed");

			return false;
		}

		recoveredData.resize(retLen);

		return (originalData == recoveredData);
	}
	else
	{
		// Call the generic function
		return AsymmetricAlgorithm::verify(publicKey, originalData, signature, mechanism, param, paramLen);
	}
}